

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_gui_component_parse_slider_2(int *utest_result,size_t utest_index)

{
  size_t utest_index_local;
  int *utest_result_local;
  
  utest_run_gui_component_parse_slider_2(utest_result);
  return;
}

Assistant:

UTEST(gui, component_parse_slider_2) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "slider2(-1, 2.5)";
    uniform_line = "uniform vec2 v0;";
    T(GUIComponentParse(0, line, uniform_line, {}, component, error));
    T(component.SliderRange.Start == -1);
    T(component.SliderRange.End == 2.5);
    T(component.UniformType == EGUIUniformTypeVec2);
    T(error.empty());

    line = "slider2()";
    uniform_line = "uniform vec2 v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid format for GUI component data '()'\nFormat should be @slider2(start_range, end_range) at line 0");

    line = "slider2(5.0)";
    uniform_line = "uniform vec v0;";
    T(!GUIComponentParse(2, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid format for GUI component data '(5.0)'\nFormat should be @slider2(start_range, end_range) at line 2");

    line = "slider2(-1, 2.5)";
    for (const auto& datatype : {"float", "vec3"}) {
        uniform_line = "uniform " + std::string(datatype) + " v0;";
        T(!GUIComponentParse(5, line, uniform_line, {}, component, error));
        TSTR(error.c_str(), "GUI component count does not match uniform component count at line 5");
    }
}